

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O2

void __thiscall
tchecker::tck_simulate::hr_display_t::hr_display_t
          (hr_display_t *this,ostream *os,shared_ptr<tchecker::zg::zg_t> *zg)

{
  invalid_argument *this_00;
  
  (this->super_display_t)._vptr_display_t = (_func_int **)&PTR__hr_display_t_00226200;
  this->_os = os;
  std::__shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_zg).super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>,
             &zg->super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>);
  if ((this->_zg).super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Invalid nullptr zone graph");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

hr_display_t::hr_display_t(std::ostream & os, std::shared_ptr<tchecker::zg::zg_t> const & zg) : _os(os), _zg(zg)
{
  if (_zg.get() == nullptr)
    throw std::invalid_argument("Invalid nullptr zone graph");
}